

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar1 = a->d[1];
  uVar2 = a->d[2];
  uVar3 = a->d[3];
  uVar4 = a->d[0];
  uVar7 = 0;
  uVar8 = ~uVar4 + 0xbfd25e8cd0364142;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar8 = uVar7;
  }
  r->d[0] = uVar8;
  uVar5 = (ulong)(0x402da1732fc9bebd < ~uVar4);
  uVar9 = ~a->d[1] + uVar5;
  uVar8 = uVar9 + 0xbaaedce6af48a03b;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar8 = uVar7;
  }
  uVar10 = (ulong)CARRY8(~a->d[1],uVar5);
  r->d[1] = uVar8;
  uVar5 = a->d[2];
  uVar9 = (ulong)(0x4551231950b75fc4 < uVar9);
  uVar6 = ~uVar5 + uVar10;
  uVar11 = uVar6 + uVar9;
  uVar8 = uVar11 - 2;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar8 = uVar7;
  }
  r->d[2] = uVar8;
  uVar8 = (~a->d[3] + (ulong)(CARRY8(~uVar5,uVar10) || CARRY8(uVar6,uVar9)) + (ulong)(1 < uVar11)) -
          1;
  if (((uVar1 == 0 && uVar2 == 0) && uVar3 == 0) && uVar4 == 0) {
    uVar8 = uVar7;
  }
  r->d[3] = uVar8;
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    uint64_t nonzero = 0xFFFFFFFFFFFFFFFFULL * (secp256k1_scalar_is_zero(a) == 0);
    uint128_t t = (uint128_t)(~a->d[0]) + SECP256K1_N_0 + 1;
    r->d[0] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[1]) + SECP256K1_N_1;
    r->d[1] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[2]) + SECP256K1_N_2;
    r->d[2] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[3]) + SECP256K1_N_3;
    r->d[3] = t & nonzero;
}